

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall CIdExp::CIdExp(CIdExp *this,char *name)

{
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *name_local;
  CIdExp *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  IExpression::IExpression((IExpression *)this);
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236df8;
  std::__cxx11::string::string((string *)&this->name);
  pcVar1 = local_18;
  this->isInstance = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::__cxx11::string::operator=((string *)&this->name,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

CIdExp::CIdExp( char *name) {
    this->name = std::string( name );
}